

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[24],wabt::(anonymous_namespace)::TagSymbol,char_const(&)[22],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [24],TagSymbol *u,char (*args) [22],Newline *args_1,
          CloseBrace *args_2,Newline *args_3)

{
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u_00;
  char *t_00;
  
  anon_unknown_0::CWriter::WriteData((CWriter *)this,"wasm_rt_load_exception(",0x17);
  anon_unknown_0::CWriter::Write((CWriter *)this,(TagSymbol *)t);
  t_00 = ", sizeof(tmp), &tmp);";
  anon_unknown_0::CWriter::WriteData((CWriter *)this,", sizeof(tmp), &tmp);",0x15);
  u_00 = extraout_RDX;
  if (*(int *)(this + 0x94) < 2) {
    t_00 = "\n";
    anon_unknown_0::CWriter::WriteData((CWriter *)this,"\n",1);
    *(int *)(this + 0x94) = *(int *)(this + 0x94) + 1;
    u_00 = extraout_RDX_00;
  }
  this[0x90] = (CWriter)0x1;
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            (this,(CloseBrace *)t_00,u_00);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }